

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O0

void __thiscall
RVO::RVOSimulator::RVOSimulator
          (RVOSimulator *this,float timeStep,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  vector<RVO::Line,_std::allocator<RVO::Line>_> *pvVar1;
  Agent *pAVar2;
  KdTree *pKVar3;
  Vector2 *in_RDX;
  size_t in_RSI;
  Agent *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  Agent *this_00;
  
  this_00 = in_RDI;
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::vector
            ((vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *)0x11157e);
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::vector
            ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)0x111591);
  pvVar1 = &in_RDI->orcaLines_;
  pAVar2 = (Agent *)operator_new(0x90);
  Agent::Agent(this_00);
  (pvVar1->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pAVar2;
  pvVar1 = &in_RDI->orcaLines_;
  pKVar3 = (KdTree *)operator_new(0x40);
  KdTree::KdTree((KdTree *)this_00,(RVOSimulator *)in_RDI);
  (pvVar1->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pKVar3;
  *(float *)&(in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = 0.0;
  *(float *)((long)&(in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = in_XMM0_Da;
  ((Agent *)
  (in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start)->velocity_ = *in_RDX;
  ((Agent *)
  (in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start)->maxNeighbors_ = in_RSI;
  ((Agent *)
  (in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start)->maxSpeed_ = in_XMM5_Da;
  ((Agent *)
  (in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start)->neighborDist_ = in_XMM1_Da;
  ((Agent *)
  (in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start)->radius_ = in_XMM4_Da;
  ((Agent *)
  (in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start)->timeHorizon_ = in_XMM2_Da;
  ((Agent *)
  (in_RDI->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start)->timeHorizonObst_ = in_XMM3_Da;
  return;
}

Assistant:

RVOSimulator::RVOSimulator(float timeStep, float neighborDist,
                           std::size_t maxNeighbors, float timeHorizon,
                           float timeHorizonObst, float radius, float maxSpeed,
                           const Vector2 &velocity)
    : defaultAgent_(new Agent()),
      kdTree_(new KdTree(this)),
      globalTime_(0.0F),
      timeStep_(timeStep) {
  defaultAgent_->velocity_ = velocity;
  defaultAgent_->maxNeighbors_ = maxNeighbors;
  defaultAgent_->maxSpeed_ = maxSpeed;
  defaultAgent_->neighborDist_ = neighborDist;
  defaultAgent_->radius_ = radius;
  defaultAgent_->timeHorizon_ = timeHorizon;
  defaultAgent_->timeHorizonObst_ = timeHorizonObst;
}